

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall argo::json::operator<(json *this,char *s)

{
  int iVar1;
  string *psVar2;
  char *__s1;
  string local_38 [32];
  char *local_18;
  char *s_local;
  json *this_local;
  
  local_18 = s;
  s_local = (char *)this;
  psVar2 = operator_cast_to_string_(this);
  std::__cxx11::string::string(local_38,(string *)psVar2);
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(__s1,local_18);
  std::__cxx11::string::~string(local_38);
  return iVar1 < 0;
}

Assistant:

bool json::operator<(const char *s) const
{
    return strcmp(static_cast<string>(*this).c_str(), s) < 0;
}